

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfp_helper.c
# Opt level: O0

float64 helper_vfp_fcvt_f16_to_f64_arm(uint32_t a,void *fpstp,uint32_t ahp_mode)

{
  flag val;
  float64 fVar1;
  float64 r;
  flag save;
  float_status *fpst;
  uint32_t ahp_mode_local;
  void *fpstp_local;
  uint32_t a_local;
  
  val = get_flush_inputs_to_zero((float_status *)fpstp);
  set_flush_inputs_to_zero('\0',(float_status *)fpstp);
  fVar1 = float16_to_float64_arm
                    ((float16)a,(_Bool)((ahp_mode != 0 ^ 0xffU) & 1),(float_status *)fpstp);
  set_flush_inputs_to_zero(val,(float_status *)fpstp);
  return fVar1;
}

Assistant:

float64 HELPER(vfp_fcvt_f16_to_f64)(uint32_t a, void *fpstp, uint32_t ahp_mode)
{
    /* Squash FZ16 to 0 for the duration of conversion.  In this case,
     * it would affect flushing input denormals.
     */
    float_status *fpst = fpstp;
    flag save = get_flush_inputs_to_zero(fpst);
    set_flush_inputs_to_zero(false, fpst);
    float64 r = float16_to_float64(a, !ahp_mode, fpst);
    set_flush_inputs_to_zero(save, fpst);
    return r;
}